

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_synth.cc
# Opt level: O2

void anon_unknown.dwarf_41f8::PrintUsage(ostream *stream)

{
  long lVar1;
  ostream *poVar2;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," world_synth - WORLD synthesizer");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       world_synth [ options ] spfile apfile [ f0file ] > stdout"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -l l  : FFT length          (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x400);
  poVar2 = std::operator<<(poVar2,"][ 512 <= l <=      ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -p p  : frame shift [point] (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x50);
  poVar2 = std::operator<<(poVar2,"][   1 <= p <=      ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -s s  : sampling rate [kHz] (double)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::ostream::_M_insert<double>(16.0);
  poVar2 = std::operator<<(poVar2,"][ 8.0 <= s <= 98.0 ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -F F  : pitch format        (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= F <= 2    ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 0 (Fs/F0)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 1 (F0)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 2 (log F0)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -S S  : spectrum format     (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= S <= 3    ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 0 (20*log|H(z)|)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 1 (ln|H(z)|)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 2 (|H(z)|)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 3 (|H(z)|^2)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -A A  : aperiodicity format (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= A <= 3    ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 0 (Ha)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 1 (Hp)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 2 (Ha/Hp)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 3 (Hp/Ha)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -h    : print this message");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  spfile:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       spectrum                    (double)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  apfile:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       aperiodicity                (double)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  f0file:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       pitch, not excitation       (double)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       waveform                    (double)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  notice:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       value of l must be a power of 2");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " world_synth - WORLD synthesizer" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       world_synth [ options ] spfile apfile [ f0file ] > stdout" << std::endl;  // NOLINT
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : FFT length          (   int)[" << std::setw(5) << std::right << kDefaultFftLength          << "][ 512 <= l <=      ]" << std::endl;  // NOLINT
  *stream << "       -p p  : frame shift [point] (   int)[" << std::setw(5) << std::right << kDefaultFrameShift         << "][   1 <= p <=      ]" << std::endl;  // NOLINT
  *stream << "       -s s  : sampling rate [kHz] (double)[" << std::setw(5) << std::right << kDefaultSamplingRate       << "][ 8.0 <= s <= 98.0 ]" << std::endl;  // NOLINT
  *stream << "       -F F  : pitch format        (   int)[" << std::setw(5) << std::right << kDefaultPitchFormat        << "][   0 <= F <= 2    ]" << std::endl;  // NOLINT
  *stream << "                 0 (Fs/F0)" << std::endl;
  *stream << "                 1 (F0)" << std::endl;
  *stream << "                 2 (log F0)" << std::endl;
  *stream << "       -S S  : spectrum format     (   int)[" << std::setw(5) << std::right << kDefaultSpectrumFormat     << "][   0 <= S <= 3    ]" << std::endl;  // NOLINT
  *stream << "                 0 (20*log|H(z)|)" << std::endl;
  *stream << "                 1 (ln|H(z)|)" << std::endl;
  *stream << "                 2 (|H(z)|)" << std::endl;
  *stream << "                 3 (|H(z)|^2)" << std::endl;
  *stream << "       -A A  : aperiodicity format (   int)[" << std::setw(5) << std::right << kDefaultAperiodicityFormat << "][   0 <= A <= 3    ]" << std::endl;  // NOLINT
  *stream << "                 0 (Ha)" << std::endl;
  *stream << "                 1 (Hp)" << std::endl;
  *stream << "                 2 (Ha/Hp)" << std::endl;
  *stream << "                 3 (Hp/Ha)" << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  spfile:" << std::endl;
  *stream << "       spectrum                    (double)" << std::endl;
  *stream << "  apfile:" << std::endl;
  *stream << "       aperiodicity                (double)" << std::endl;
  *stream << "  f0file:" << std::endl;
  *stream << "       pitch, not excitation       (double)" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       waveform                    (double)" << std::endl;
  *stream << "  notice:" << std::endl;
  *stream << "       value of l must be a power of 2" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}